

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O3

void setup_converter(archive_string_conv *sc)

{
  wchar_t wVar1;
  code *pcVar2;
  ulong uVar3;
  uint uVar4;
  
  sc->nconverter = L'\0';
  wVar1 = sc->flag;
  if ((wVar1 & 0x10U) != 0) {
    sc->nconverter = L'\x01';
    pcVar2 = strncat_from_utf8_libarchive2;
LAB_00166b32:
    sc->converter[0] = pcVar2;
    return;
  }
  if ((wVar1 & 0x1400U) != 0) {
    if (((uint)wVar1 >> 9 & 1) == 0) {
      if ((wVar1 & 4U) == 0) {
        return;
      }
      sc->nconverter = L'\x01';
      if (((uint)wVar1 >> 10 & 1) == 0) {
        pcVar2 = best_effort_strncat_to_utf16le;
      }
      else {
        pcVar2 = best_effort_strncat_to_utf16be;
      }
    }
    else {
      sc->nconverter = L'\x01';
      pcVar2 = archive_string_append_unicode;
    }
    goto LAB_00166b32;
  }
  if ((wVar1 & 0x2800U) == 0) {
    uVar4 = 0;
    if (((uint)wVar1 >> 9 & 1) != 0) {
      if ((char)wVar1 < '\0') {
        pcVar2 = archive_string_normalize_D;
LAB_00166bd5:
        sc->nconverter = L'\x01';
        sc->converter[0] = pcVar2;
        uVar4 = 1;
      }
      else {
        uVar4 = 0;
        if ((wVar1 & 0x40U) != 0) {
          pcVar2 = archive_string_normalize_C;
          goto LAB_00166bd5;
        }
      }
      if (((uint)wVar1 >> 8 & 1) != 0) {
        if ((wVar1 & 0xc0U) != 0) {
          return;
        }
        sc->nconverter = uVar4 + L'\x01';
        uVar3 = (ulong)uVar4;
        pcVar2 = strncat_from_utf8_to_utf8;
        goto LAB_00166c04;
      }
    }
    if (((wVar1 & 4U) == 0) && (sc->same == L'\0')) goto LAB_00166c0a;
    sc->nconverter = uVar4 + L'\x01';
    uVar3 = (ulong)uVar4;
    pcVar2 = best_effort_strncat_in_locale;
    goto LAB_00166c04;
  }
  if ((char)wVar1 < '\0') {
    pcVar2 = archive_string_normalize_D;
LAB_00166b65:
    sc->nconverter = L'\x01';
    sc->converter[0] = pcVar2;
    uVar4 = 1;
  }
  else {
    uVar4 = 0;
    if ((wVar1 & 0x40U) != 0) {
      pcVar2 = archive_string_normalize_C;
      goto LAB_00166b65;
    }
  }
  if (((uint)wVar1 >> 8 & 1) == 0) {
    if ((~wVar1 & 0x804U) == 0) {
      sc->nconverter = uVar4 + L'\x01';
      uVar3 = (ulong)uVar4;
      pcVar2 = best_effort_strncat_from_utf16be;
    }
    else {
      if ((~wVar1 & 0x2004U) != 0) {
LAB_00166c0a:
        sc->nconverter = L'\0';
        return;
      }
      sc->nconverter = uVar4 + L'\x01';
      uVar3 = (ulong)uVar4;
      pcVar2 = best_effort_strncat_from_utf16le;
    }
  }
  else {
    if ((wVar1 & 0xc0U) != 0) {
      return;
    }
    sc->nconverter = uVar4 + L'\x01';
    uVar3 = (ulong)uVar4;
    pcVar2 = archive_string_append_unicode;
  }
LAB_00166c04:
  sc->converter[uVar3] = pcVar2;
  return;
}

Assistant:

static void
setup_converter(struct archive_string_conv *sc)
{

	/* Reset. */
	sc->nconverter = 0;

	/*
	 * Perform special sequence for the incorrect UTF-8 filenames
	 * made by libarchive2.x.
	 */
	if (sc->flag & SCONV_UTF8_LIBARCHIVE_2) {
		add_converter(sc, strncat_from_utf8_libarchive2);
		return;
	}

	/*
	 * Convert a string to UTF-16BE/LE.
	 */
	if (sc->flag & SCONV_TO_UTF16) {
		/*
		 * If the current locale is UTF-8, we can translate
		 * a UTF-8 string into a UTF-16BE string.
		 */
		if (sc->flag & SCONV_FROM_UTF8) {
			add_converter(sc, archive_string_append_unicode);
			return;
		}

#if defined(_WIN32) && !defined(__CYGWIN__)
		if (sc->flag & SCONV_WIN_CP) {
			if (sc->flag & SCONV_TO_UTF16BE)
				add_converter(sc, win_strncat_to_utf16be);
			else
				add_converter(sc, win_strncat_to_utf16le);
			return;
		}
#endif

#if defined(HAVE_ICONV)
		if (sc->cd != (iconv_t)-1) {
			add_converter(sc, iconv_strncat_in_locale);
			return;
		}
#endif

		if (sc->flag & SCONV_BEST_EFFORT) {
			if (sc->flag & SCONV_TO_UTF16BE)
				add_converter(sc,
					best_effort_strncat_to_utf16be);
			else
				add_converter(sc,
					best_effort_strncat_to_utf16le);
		} else
			/* Make sure we have no converter. */
			sc->nconverter = 0;
		return;
	}

	/*
	 * Convert a string from UTF-16BE/LE.
	 */
	if (sc->flag & SCONV_FROM_UTF16) {
		/*
		 * At least we should normalize a UTF-16BE string.
		 */
		if (sc->flag & SCONV_NORMALIZATION_D)
			add_converter(sc,archive_string_normalize_D);
		else if (sc->flag & SCONV_NORMALIZATION_C)
			add_converter(sc, archive_string_normalize_C);

		if (sc->flag & SCONV_TO_UTF8) {
			/*
			 * If the current locale is UTF-8, we can translate
			 * a UTF-16BE/LE string into a UTF-8 string directly.
			 */
			if (!(sc->flag &
			    (SCONV_NORMALIZATION_D |SCONV_NORMALIZATION_C)))
				add_converter(sc,
				    archive_string_append_unicode);
			return;
		}

#if defined(_WIN32) && !defined(__CYGWIN__)
		if (sc->flag & SCONV_WIN_CP) {
			if (sc->flag & SCONV_FROM_UTF16BE)
				add_converter(sc, win_strncat_from_utf16be);
			else
				add_converter(sc, win_strncat_from_utf16le);
			return;
		}
#endif

#if defined(HAVE_ICONV)
		if (sc->cd != (iconv_t)-1) {
			add_converter(sc, iconv_strncat_in_locale);
			return;
		}
#endif

		if ((sc->flag & (SCONV_BEST_EFFORT | SCONV_FROM_UTF16BE))
		    == (SCONV_BEST_EFFORT | SCONV_FROM_UTF16BE))
			add_converter(sc, best_effort_strncat_from_utf16be);
		else if ((sc->flag & (SCONV_BEST_EFFORT | SCONV_FROM_UTF16LE))
		    == (SCONV_BEST_EFFORT | SCONV_FROM_UTF16LE))
			add_converter(sc, best_effort_strncat_from_utf16le);
		else
			/* Make sure we have no converter. */
			sc->nconverter = 0;
		return;
	}

	if (sc->flag & SCONV_FROM_UTF8) {
		/*
		 * At least we should normalize a UTF-8 string.
		 */
		if (sc->flag & SCONV_NORMALIZATION_D)
			add_converter(sc,archive_string_normalize_D);
		else if (sc->flag & SCONV_NORMALIZATION_C)
			add_converter(sc, archive_string_normalize_C);

		/*
		 * Copy UTF-8 string with a check of CESU-8.
		 * Apparently, iconv does not check surrogate pairs in UTF-8
		 * when both from-charset and to-charset are UTF-8, and then
		 * we use our UTF-8 copy code.
		 */
		if (sc->flag & SCONV_TO_UTF8) {
			/*
			 * If the current locale is UTF-8, we can translate
			 * a UTF-16BE string into a UTF-8 string directly.
			 */
			if (!(sc->flag &
			    (SCONV_NORMALIZATION_D |SCONV_NORMALIZATION_C)))
				add_converter(sc, strncat_from_utf8_to_utf8);
			return;
		}
	}

#if defined(_WIN32) && !defined(__CYGWIN__)
	/*
	 * On Windows we can use Windows API for a string conversion.
	 */
	if (sc->flag & SCONV_WIN_CP) {
		add_converter(sc, strncat_in_codepage);
		return;
	}
#endif

#if HAVE_ICONV
	if (sc->cd != (iconv_t)-1) {
		add_converter(sc, iconv_strncat_in_locale);
		/*
		 * iconv generally does not support UTF-8-MAC and so
		 * we have to the output of iconv from NFC to NFD if
		 * need.
		 */
		if ((sc->flag & SCONV_FROM_CHARSET) &&
		    (sc->flag & SCONV_TO_UTF8)) {
			if (sc->flag & SCONV_NORMALIZATION_D)
				add_converter(sc, archive_string_normalize_D);
		}
		return;
	}
#endif

	/*
	 * Try conversion in the best effort or no conversion.
	 */
	if ((sc->flag & SCONV_BEST_EFFORT) || sc->same)
		add_converter(sc, best_effort_strncat_in_locale);
	else
		/* Make sure we have no converter. */
		sc->nconverter = 0;
}